

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O3

PreprocessorOptions * __thiscall
slang::Bag::getOrDefault<slang::parsing::PreprocessorOptions>
          (PreprocessorOptions *__return_storage_ptr__,Bag *this)

{
  pointer pcVar1;
  PreprocessorOptions *pPVar2;
  sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *psVar3;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_31;
  
  pPVar2 = get<slang::parsing::PreprocessorOptions>(this);
  if (pPVar2 == (PreprocessorOptions *)0x0) {
    *(undefined8 *)__return_storage_ptr__ = 0;
    (__return_storage_ptr__->predefineSource)._M_dataplus._M_p = (pointer)0x0;
    (__return_storage_ptr__->predefineSource)._M_string_length = 0;
    (__return_storage_ptr__->predefineSource).field_2._M_allocated_capacity = 0;
    (__return_storage_ptr__->predefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->predefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->predefineSource).field_2 + 8) = 0;
    (__return_storage_ptr__->predefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->undefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->undefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->undefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    .entries = (EntryPointer)0x0;
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    .num_slots_minus_one = 0;
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    .hash_policy = '\0';
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    .max_lookups = '\0';
    *(undefined2 *)
     &(__return_storage_ptr__->ignoreDirectives).
      super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      .field_0x12 = 0;
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ._max_load_factor = 0.0;
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    .num_elements = 0;
    __return_storage_ptr__->maxIncludeDepth = 0x400;
    (__return_storage_ptr__->predefineSource)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->predefineSource).field_2;
    *(undefined4 *)&(__return_storage_ptr__->predefineSource).field_2 = 0x6970613c;
    (__return_storage_ptr__->predefineSource).field_2._M_local_buf[4] = '>';
    (__return_storage_ptr__->predefineSource)._M_string_length = 5;
    (__return_storage_ptr__->predefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->predefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->predefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->undefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->undefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->undefines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar3 = ska::detailv3::empty_default_table<std::basic_string_view<char,std::char_traits<char>>>
                       ();
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    .entries = psVar3;
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    .num_slots_minus_one = 0;
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    .hash_policy = '?';
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    .max_lookups = '\x03';
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ._max_load_factor = 0.5;
    (__return_storage_ptr__->ignoreDirectives).
    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    .num_elements = 0;
  }
  else {
    __return_storage_ptr__->maxIncludeDepth = pPVar2->maxIncludeDepth;
    (__return_storage_ptr__->predefineSource)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->predefineSource).field_2;
    pcVar1 = (pPVar2->predefineSource)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->predefineSource,pcVar1,
               pcVar1 + (pPVar2->predefineSource)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->predefines,&pPVar2->predefines);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->undefines,&pPVar2->undefines);
    ska::detailv3::
    sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::sherwood_v3_table(&(__return_storage_ptr__->ignoreDirectives).
                         super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        ,&(pPVar2->ignoreDirectives).
                          super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        ,&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

T getOrDefault() const {
        const T* result = get<T>();
        if (result)
            return *result;
        return T();
    }